

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

void tag_eval(mdl_t *mdl,double *te,double *se)

{
  uint W;
  uint32_t size;
  uint32_t batch;
  void *__ptr;
  long lVar1;
  undefined8 *puVar2;
  dat_t *pdVar3;
  void **ud;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  void *apvStack_70 [2];
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  double *local_40;
  double *local_38;
  
  pdVar3 = mdl->devel;
  W = mdl->opt->nthread;
  uVar5 = (ulong)W;
  if (pdVar3 == (dat_t *)0x0) {
    pdVar3 = mdl->train;
  }
  lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
  ud = (void **)((long)apvStack_70 + lVar1 + 8);
  local_40 = se;
  local_38 = te;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      *(undefined8 *)((long)apvStack_70 + lVar1) = 0x107d4f;
      puVar2 = (undefined8 *)xmalloc(0x30);
      ud[uVar4] = puVar2;
      *puVar2 = mdl;
      *(dat_t **)((long)ud[uVar4] + 8) = pdVar3;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  size = pdVar3->nseq;
  batch = mdl->opt->jobsize;
  *(undefined8 *)((long)apvStack_70 + lVar1) = 0x107d83;
  mth_spawn(tag_evalsub,W,ud,size,batch);
  if (uVar5 == 0) {
    dVar6 = NAN;
    dVar8 = NAN;
  }
  else {
    apvStack_70[1] = (void *)0x0;
    uStack_60 = 0;
    uVar4 = 0;
    local_58 = 0;
    uStack_50 = 0;
    do {
      __ptr = ud[uVar4];
      local_58 = local_58 + *(long *)((long)__ptr + 0x10);
      uStack_50 = uStack_50 + *(long *)((long)__ptr + 0x20);
      apvStack_70[1] = (void *)((long)apvStack_70[1] + *(long *)((long)__ptr + 0x18));
      uStack_60 = uStack_60 + *(long *)((long)__ptr + 0x28);
      *(undefined8 *)((long)apvStack_70 + lVar1) = 0x107dcd;
      free(__ptr);
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    auVar7._0_8_ = ((double)((ulong)apvStack_70[1] >> 0x20 | 0x4530000000000000) -
                   1.9342813118337666e+25) +
                   (double)((ulong)apvStack_70[1] & 0xffffffff | 0x4330000000000000);
    auVar7._8_8_ = ((double)(uStack_60 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                   (double)(uStack_60 & 0xffffffff | 0x4330000000000000);
    auVar9._0_8_ = ((double)(local_58 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                   (double)(local_58 & 0xffffffff | 0x4330000000000000);
    auVar9._8_8_ = ((double)(uStack_50 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                   (double)(uStack_50 & 0xffffffff | 0x4330000000000000);
    auVar7 = divpd(auVar7,auVar9);
    dVar6 = auVar7._0_8_ * 100.0;
    dVar8 = auVar7._8_8_ * 100.0;
  }
  *local_38 = dVar6;
  *local_40 = dVar8;
  return;
}

Assistant:

void tag_eval(mdl_t *mdl, double *te, double *se) {
	const uint32_t W = mdl->opt->nthread;
	dat_t *dat = (mdl->devel == NULL) ? mdl->train : mdl->devel;
	// First we prepare the eval state for all the workers threads, we just
	// have to give them the model and dataset to use. This state will be
	// used to retrieve partial result they computed.
	eval_t *eval[W];
	for (uint32_t w = 0; w < W; w++) {
		eval[w] = xmalloc(sizeof(eval_t));
		eval[w]->mdl = mdl;
		eval[w]->dat = dat;
	}
	// And next, we call the workers to do the job and reduce the partial
	// result by summing them and computing the final error rates.
	mth_spawn((func_t *)tag_evalsub, W, (void *)eval, dat->nseq,
		mdl->opt->jobsize);
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	for (uint32_t w = 0; w < W; w++) {
		tcnt += eval[w]->tcnt;
		terr += eval[w]->terr;
		scnt += eval[w]->scnt;
		serr += eval[w]->serr;
		free(eval[w]);
	}
	*te = (double)terr / tcnt * 100.0;
	*se = (double)serr / scnt * 100.0;
}